

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferingScanTarget.cpp
# Opt level: O0

uint8_t * __thiscall
Outputs::Display::BufferingScanTarget::begin_data
          (BufferingScanTarget *this,size_t required_length,size_t required_alignment)

{
  bool bVar1;
  ushort uVar2;
  PointerSet PVar3;
  ulong uVar4;
  uint uVar5;
  int previous_distance;
  int end_distance;
  PointerSet read_pointers;
  int end_address;
  uint16_t end_x;
  uint16_t aligned_start_x;
  uint16_t output_y;
  lock_guard<std::mutex> lock_guard;
  size_t required_alignment_local;
  size_t required_length_local;
  BufferingScanTarget *this_local;
  
  lock_guard._M_device = (mutex_type *)required_alignment;
  if (required_alignment == 0) {
    __assert_fail("required_alignment",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/ScanTargets/BufferingScanTarget.cpp"
                  ,0x21,
                  "virtual uint8_t *Outputs::Display::BufferingScanTarget::begin_data(size_t, size_t)"
                 );
  }
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&aligned_start_x,&this->producer_mutex_);
  if ((this->allocation_has_failed_ & 1U) == 0) {
    if ((this->write_area_ == (uint8_t *)0x0) || (this->data_type_size_ == 0)) {
      this->allocation_has_failed_ = true;
      this_local = (BufferingScanTarget *)0x0;
    }
    else {
      uVar5 = (this->write_pointers_).write_area >> 0xb;
      end_address._2_2_ = (ushort)uVar5;
      uVar2 = ((ushort)(this->write_pointers_).write_area & 0x7ff) + 1;
      end_address._0_2_ =
           uVar2 + (short)(((long)lock_guard._M_device - (ulong)uVar2 % (ulong)lock_guard._M_device)
                          % (ulong)lock_guard._M_device);
      read_pointers.line = (ushort)end_address + (short)required_length + 1;
      if (0x800 < read_pointers.line) {
        end_address._2_2_ = (ushort)((ulong)((uVar5 & 0xffff) + 1) % 0x800);
        end_address._0_2_ = (ushort)lock_guard._M_device;
        read_pointers.line = (ushort)end_address + (short)required_length + 1;
      }
      PVar3 = std::atomic<Outputs::Display::BufferingScanTarget::PointerSet>::load
                        (&this->read_pointers_,memory_order_relaxed);
      previous_distance = PVar3.write_area;
      if ((((uint)end_address._2_2_ << 0xb | (uint)read_pointers.line) - previous_distance &
          0x3fffff) < ((this->write_pointers_).write_area - previous_distance & 0x3fffffU)) {
        this->allocation_has_failed_ = true;
        this_local = (BufferingScanTarget *)0x0;
      }
      else {
        if (((this->data_is_allocated_ ^ 0xffU) & 1) == 0) {
          __assert_fail("!data_is_allocated_",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/ScanTargets/BufferingScanTarget.cpp"
                        ,0x51,
                        "virtual uint8_t *Outputs::Display::BufferingScanTarget::begin_data(size_t, size_t)"
                       );
        }
        this->data_is_allocated_ = true;
        uVar5 = (uint)end_address._2_2_ << 0xb | (uint)(ushort)end_address;
        (this->write_pointers_).write_area = uVar5;
        this->vended_write_area_pointer_ = uVar5;
        bVar1 = false;
        if (0 < (this->write_pointers_).write_area) {
          uVar4 = ((long)(this->write_pointers_).write_area + required_length + 1) *
                  this->data_type_size_;
          bVar1 = uVar4 < this->data_type_size_ * 0x400000 ||
                  uVar4 + this->data_type_size_ * -0x400000 == 0;
        }
        if (!bVar1) {
          __assert_fail("write_pointers_.write_area >= 1 && ((size_t(write_pointers_.write_area) + required_length + 1) * data_type_size_) <= WriteAreaWidth*WriteAreaHeight*data_type_size_"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/ScanTargets/BufferingScanTarget.cpp"
                        ,0x55,
                        "virtual uint8_t *Outputs::Display::BufferingScanTarget::begin_data(size_t, size_t)"
                       );
        }
        this_local = (BufferingScanTarget *)
                     (this->write_area_ +
                     (long)(this->write_pointers_).write_area * this->data_type_size_);
      }
    }
  }
  else {
    this_local = (BufferingScanTarget *)0x0;
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&aligned_start_x);
  return (uint8_t *)this_local;
}

Assistant:

uint8_t *BufferingScanTarget::begin_data(size_t required_length, size_t required_alignment) {
	assert(required_alignment);

	// Acquire the standard producer lock, nominally over write_pointers_.
	std::lock_guard lock_guard(producer_mutex_);

	// If allocation has already failed on this line, continue the trend.
	if(allocation_has_failed_) return nullptr;

	// If there isn't yet a write area or data size then mark allocation as failed and finish.
	if(!write_area_ || !data_type_size_) {
		allocation_has_failed_ = true;
		return nullptr;
	}

	// Determine where the proposed write area would start and end.
	uint16_t output_y = TextureAddressGetY(write_pointers_.write_area);

	uint16_t aligned_start_x = TextureAddressGetX(write_pointers_.write_area & 0xffff) + 1;
	aligned_start_x += uint16_t((required_alignment - aligned_start_x%required_alignment)%required_alignment);

	uint16_t end_x = aligned_start_x + uint16_t(1 + required_length);

	if(end_x > WriteAreaWidth) {
		output_y = (output_y + 1) % WriteAreaHeight;
		aligned_start_x = uint16_t(required_alignment);
		end_x = aligned_start_x + uint16_t(1 + required_length);
	}

	// Check whether that steps over the read pointer; if so then the final address will be closer
	// to the write pointer than the old.
	const auto end_address = TextureAddress(end_x, output_y);
	const auto read_pointers = read_pointers_.load(std::memory_order::memory_order_relaxed);

	const auto end_distance = TextureSub(end_address, read_pointers.write_area);
	const auto previous_distance = TextureSub(write_pointers_.write_area, read_pointers.write_area);

	// Perform a quick sanity check.
	assert(end_distance >= 0);
	assert(previous_distance >= 0);

	// If allocating this would somehow make the write pointer back away from the read pointer,
	// there must not be enough space left.
	if(end_distance < previous_distance) {
		allocation_has_failed_ = true;
		return nullptr;
	}

	// Everything checks out, note expectation of a future end_data and return the pointer.
	assert(!data_is_allocated_);
	data_is_allocated_ = true;
	vended_write_area_pointer_ = write_pointers_.write_area = TextureAddress(aligned_start_x, output_y);

	assert(write_pointers_.write_area >= 1 && ((size_t(write_pointers_.write_area) + required_length + 1) * data_type_size_) <= WriteAreaWidth*WriteAreaHeight*data_type_size_);
	return &write_area_[size_t(write_pointers_.write_area) * data_type_size_];

	// Note state at exit:
	//		write_pointers_.write_area points to the first pixel the client is expected to draw to.
}